

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_long,wchar_t,fmt::v5::internal::no_thousands_sep>
                    (long param_1,ulong param_2,uint param_3)

{
  wchar_t *pwVar1;
  long lVar2;
  uint index;
  uint index_1;
  wchar_t *end;
  ulong local_20;
  wchar_t *local_18;
  no_thousands_sep local_9 [9];
  
  pwVar1 = (wchar_t *)(param_1 + (ulong)param_3 * 4);
  local_20 = param_2;
  local_18 = pwVar1;
  while (99 < local_20) {
    lVar2 = (local_20 % 100) * 2;
    local_20 = local_20 / 100;
    local_18[-1] = (int)(char)basic_data<void>::DIGITS[(int)lVar2 + 1];
    no_thousands_sep::operator()(local_9,local_18 + -1);
    local_18[-2] = (int)(char)basic_data<void>::DIGITS[lVar2];
    no_thousands_sep::operator()(local_9,local_18 + -2);
    local_18 = local_18 + -2;
  }
  if (local_20 < 10) {
    local_18[-1] = (int)(char)((char)local_20 + '0');
  }
  else {
    local_18[-1] = (int)(char)basic_data<void>::DIGITS[(int)(local_20 << 1) + 1];
    no_thousands_sep::operator()(local_9,local_18 + -1);
    local_18[-2] = (int)(char)basic_data<void>::DIGITS[local_20 << 1 & 0xffffffff];
  }
  return pwVar1;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, unsigned num_digits,
                            ThousandsSep thousands_sep) {
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = data::DIGITS[index];
  return end;
}